

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall clipp::param_filter::operator()(param_filter *this,parameter *p)

{
  bool bVar1;
  ulong uVar2;
  const_iterator __first;
  const_iterator __last;
  parameter *in_RSI;
  anon_class_8_1_8991fb9c_for__M_pred in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  bool local_1;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    parameter::flags_abi_cxx11_(in_RSI);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(in_stack_ffffffffffffffb8);
    parameter::flags_abi_cxx11_(in_RSI);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator()((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )__last._M_current,in_RDI);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  required(in_RDI.this);
  parameter::required(in_RSI);
  bVar1 = clipp::operator!=(no,false);
  if (bVar1) {
    local_1 = false;
  }
  else {
    blocking(in_RDI.this);
    detail::token<clipp::parameter>::blocking(&in_RSI->super_token<clipp::parameter>);
    bVar1 = clipp::operator!=(no,false);
    if (bVar1) {
      local_1 = false;
    }
    else {
      repeatable(in_RDI.this);
      detail::token<clipp::parameter>::repeatable(&in_RSI->super_token<clipp::parameter>);
      bVar1 = clipp::operator!=(no,false);
      if (bVar1) {
        local_1 = false;
      }
      else {
        has_doc(in_RDI.this);
        detail::token<clipp::parameter>::doc_abi_cxx11_(&in_RSI->super_token<clipp::parameter>);
        std::__cxx11::string::empty();
        bVar1 = clipp::operator!=(no,false);
        if (bVar1) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool operator() (const parameter& p) const noexcept {
        if(!prefix_.empty()) {
            if(!std::any_of(p.flags().begin(), p.flags().end(),
                [&](const arg_string& flag){
                    return str::has_prefix(flag, prefix_);
                })) return false;
        }
        if(required()   != p.required())     return false;
        if(blocking()   != p.blocking())     return false;
        if(repeatable() != p.repeatable())   return false;
        if(has_doc()    != !p.doc().empty()) return false;
        return true;
    }